

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FStream.cxx
# Opt level: O0

BOM cmsys::FStream::ReadBOM(istream *in)

{
  ulong uVar1;
  streamoff __off;
  fpos<__mbstate_t> local_80;
  fpos<__mbstate_t> local_70;
  fpos local_60 [16];
  streamoff local_50;
  unsigned_long p;
  __mbstate_t local_40;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  undefined8 uStack_30;
  uchar bom [4];
  unsigned_long orig;
  istream *in_local;
  
  uVar1 = std::ios::good();
  if ((uVar1 & 1) != 0) {
    uStack_30 = std::istream::tellg();
    __off = std::fpos::operator_cast_to_long((fpos *)&stack0xffffffffffffffd0);
    std::istream::read((char *)in,(long)&local_34);
    uVar1 = std::ios::good();
    if ((uVar1 & 1) == 0) {
      std::ios::clear((int)in + (int)*(undefined8 *)(*(long *)in + -0x18));
      std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)&p,__off);
      std::istream::seekg(in,p,local_40);
    }
    else {
      if ((local_34 == -0x11) && (local_33 == -0x45)) {
        std::istream::read((char *)in,(long)&local_32);
        uVar1 = std::ios::good();
        if (((uVar1 & 1) != 0) && (local_32 == -0x41)) {
          return BOM_UTF8;
        }
      }
      else {
        if ((local_34 == -2) && (local_33 == -1)) {
          return BOM_UTF16BE;
        }
        if ((local_34 == '\0') && (local_33 == '\0')) {
          std::istream::read((char *)in,(long)&local_32);
          uVar1 = std::ios::good();
          if ((((uVar1 & 1) != 0) && (local_32 == -2)) && (local_31 == -1)) {
            return BOM_UTF32BE;
          }
        }
        else if ((local_34 == -1) && (local_33 == -2)) {
          local_60 = (fpos  [16])std::istream::tellg();
          local_50 = std::fpos::operator_cast_to_long(local_60);
          std::istream::read((char *)in,(long)&local_32);
          uVar1 = std::ios::good();
          if ((((uVar1 & 1) != 0) && (local_32 == '\0')) && (local_31 == '\0')) {
            return BOM_UTF32LE;
          }
          std::fpos<__mbstate_t>::fpos(&local_70,local_50);
          std::istream::seekg(in,local_70._M_off,local_70._M_state);
          return BOM_UTF16LE;
        }
      }
      std::ios::clear((int)in + (int)*(undefined8 *)(*(long *)in + -0x18));
      std::fpos<__mbstate_t>::fpos(&local_80,__off);
      std::istream::seekg(in,local_80._M_off,local_80._M_state);
    }
  }
  return BOM_None;
}

Assistant:

BOM ReadBOM(std::istream& in)
{
  if (!in.good()) {
    return BOM_None;
  }
  unsigned long orig = in.tellg();
  unsigned char bom[4];
  in.read(reinterpret_cast<char*>(bom), 2);
  if (!in.good()) {
    in.clear();
    in.seekg(orig);
    return BOM_None;
  }
  if (bom[0] == 0xEF && bom[1] == 0xBB) {
    in.read(reinterpret_cast<char*>(bom + 2), 1);
    if (in.good() && bom[2] == 0xBF) {
      return BOM_UTF8;
    }
  } else if (bom[0] == 0xFE && bom[1] == 0xFF) {
    return BOM_UTF16BE;
  } else if (bom[0] == 0x00 && bom[1] == 0x00) {
    in.read(reinterpret_cast<char*>(bom + 2), 2);
    if (in.good() && bom[2] == 0xFE && bom[3] == 0xFF) {
      return BOM_UTF32BE;
    }
  } else if (bom[0] == 0xFF && bom[1] == 0xFE) {
    unsigned long p = in.tellg();
    in.read(reinterpret_cast<char*>(bom + 2), 2);
    if (in.good() && bom[2] == 0x00 && bom[3] == 0x00) {
      return BOM_UTF32LE;
    }
    in.seekg(p);
    return BOM_UTF16LE;
  }
  in.clear();
  in.seekg(orig);
  return BOM_None;
}